

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WabtInterface.cpp
# Opt level: O0

Var Js::Int64ToVar(int64 value,void *user_data)

{
  Var pvVar1;
  Context *ctx;
  void *user_data_local;
  int64 value_local;
  
  pvVar1 = JavascriptNumber::ToVar(value,*(ScriptContext **)((long)user_data + 8));
  return pvVar1;
}

Assistant:

Js::Var Int64ToVar(int64 value, void* user_data)
{
    Context* ctx = (Context*)user_data;
    return JavascriptNumber::ToVar(value, ctx->scriptContext);
}